

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O1

assetsys_error_t
assetsys_file_load(assetsys_t *sys,assetsys_file_t f,int *size,void *buffer,int capacity)

{
  char *__dest;
  assetsys_internal_mount_t *paVar1;
  assetsys_internal_mount_t *paVar2;
  uint uVar3;
  mz_bool mVar4;
  assetsys_error_t aVar5;
  strpool_internal_entry_t *psVar6;
  FILE *__stream;
  size_t sVar7;
  assetsys_internal_file_t *paVar8;
  char *__src;
  unsigned_long_long *puVar9;
  long lVar10;
  int iVar11;
  
  uVar3 = 0xffffffff;
  if (0 < (long)sys->mounts_count) {
    puVar9 = &sys->mounts->mounted_as;
    lVar10 = 0;
    do {
      if ((*puVar9 == f.mount) && (((assetsys_internal_mount_t *)(puVar9 + -1))->path == f.path)) {
        uVar3 = (uint)lVar10;
        break;
      }
      lVar10 = lVar10 + 1;
      puVar9 = puVar9 + 0x13;
    } while (sys->mounts_count != lVar10);
  }
  if ((int)uVar3 < 0) {
    aVar5 = ASSETSYS_ERROR_INVALID_MOUNT;
  }
  else {
    paVar2 = sys->mounts;
    paVar1 = paVar2 + uVar3;
    paVar8 = paVar2[uVar3].files + f.index;
    if (paVar2[uVar3].type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP) {
      if (size != (int *)0x0) {
        *size = paVar8->size;
      }
      aVar5 = ASSETSYS_ERROR_BUFFER_TOO_SMALL;
      if (paVar8->size <= capacity) {
        mVar4 = mz_zip_reader_extract_to_mem_no_alloc
                          (&paVar1->zip,paVar8->zip_index,buffer,(long)paVar8->size,0,(void *)0x0,0)
        ;
        aVar5 = (uint)(mVar4 != 0) * 5 + ASSETSYS_ERROR_FAILED_TO_READ_FILE;
      }
    }
    else {
      if (size != (int *)0x0) {
        *size = paVar8->size;
      }
      __dest = sys->temp;
      psVar6 = strpool_internal_get_entry(&sys->strpool,paVar1->path);
      strcpy(__dest,psVar6->data + 8);
      __src = "/";
      if (sys->temp[0] == '\0') {
        __src = "";
      }
      strcat(__dest,__src);
      psVar6 = strpool_internal_get_entry(&sys->strpool,sys->collated[paVar8->collated_index].path);
      strcat(__dest,psVar6->data + (long)paVar1->mount_len + 9);
      __stream = fopen(__dest,"rb");
      if (__stream == (FILE *)0x0) {
        aVar5 = ASSETSYS_ERROR_FAILED_TO_READ_FILE;
      }
      else {
        fseek(__stream,0,2);
        lVar10 = ftell(__stream);
        fseek(__stream,0,0);
        iVar11 = (int)lVar10;
        if (size != (int *)0x0) {
          *size = iVar11;
        }
        if (capacity < iVar11) {
          fclose(__stream);
          aVar5 = ASSETSYS_ERROR_BUFFER_TOO_SMALL;
        }
        else {
          sVar7 = fread(buffer,1,(long)iVar11,__stream);
          fclose(__stream);
          aVar5 = (uint)((int)sVar7 == iVar11) * 5 + ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        }
      }
    }
  }
  return aVar5;
}

Assistant:

assetsys_error_t assetsys_file_load( assetsys_t* sys, assetsys_file_t f, int* size, void* buffer, int capacity )
    {
    int mount_index = assetsys_internal_find_mount_index( sys, f.mount, f.path );
    if( mount_index < 0 ) return ASSETSYS_ERROR_INVALID_MOUNT;

    struct assetsys_internal_mount_t* mount = &sys->mounts[ mount_index ];
    struct assetsys_internal_file_t* file = &mount->files[ f.index ];
    if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP )
        {
        if( size ) *size = (int) file->size;
        if( file->size > capacity ) return ASSETSYS_ERROR_BUFFER_TOO_SMALL;

        mz_bool result = mz_zip_reader_extract_to_mem_no_alloc( &mount->zip, (mz_uint) file->zip_index, buffer, 
            (size_t) file->size, 0, 0, 0 ); 
        return result ? ASSETSYS_SUCCESS : ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        }
    else
        {
        if( size ) *size = file->size;
        strcpy( sys->temp, assetsys_internal_get_string( sys, mount->path ) );
        strcat( sys->temp, *sys->temp == '\0' ? "" : "/" );
        strcat( sys->temp, assetsys_internal_get_string( sys, 
            sys->collated[ file->collated_index ].path ) + mount->mount_len + 1 );
        FILE* fp = fopen( sys->temp, "rb" );
        if( !fp ) return ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        
        fseek( fp, 0, SEEK_END );
        int file_size = (int) ftell( fp );
        fseek( fp, 0, SEEK_SET );
        if( size ) *size = file_size;

        if( file_size > capacity ) { fclose( fp ); return ASSETSYS_ERROR_BUFFER_TOO_SMALL; }

        int size_read = (int) fread( buffer, 1, (size_t) file_size, fp );
        fclose( fp );
        if( size_read != file_size ) return ASSETSYS_ERROR_FAILED_TO_READ_FILE;

        return ASSETSYS_SUCCESS;
        }
    }